

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

bool mjs::is_reserved(token_type t,version v)

{
  logic_error *this;
  bool local_2e;
  bool local_2d;
  version v_local;
  token_type t_local;
  
  if (v == es1) {
    local_2d = find_token<16ul>(t,(token_type (*) [16])es1_reserved_tokens);
  }
  else {
    if (v == es3) {
      local_2e = find_token<31ul>(t,(token_type (*) [31])es3_reserved_tokens);
    }
    else {
      if (v != es5) {
        this = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this,"Invalid version");
        __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      local_2e = find_token<7ul>(t,(token_type (*) [7])es5_reserved_tokens);
    }
    local_2d = local_2e;
  }
  return local_2d;
}

Assistant:

constexpr bool is_reserved(token_type t, version v) {
    return v == version::es1 ? find_token(t, es1_reserved_tokens) :
           v == version::es3 ? find_token(t, es3_reserved_tokens) :
           v == version::es5 ? find_token(t, es5_reserved_tokens) :
           throw std::logic_error{"Invalid version"};
}